

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall
GoState<3u,3u>::
do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
          (GoState<3U,_3U> *this,
          mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *engine)

{
  bool bVar1;
  result_type __n;
  reference pvVar2;
  long *in_RDI;
  value_type move;
  uniform_int_distribution<unsigned_long> move_ind;
  vector<int,_std::allocator<int>_> moves;
  int in_stack_000001f4;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffff98;
  uniform_int_distribution<unsigned_long> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  value_type vVar3;
  vector<int,_std::allocator<int>_> local_28;
  
  (**(code **)(*in_RDI + 0x60))(&local_28);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (bVar1) {
    MCTS::assertion_failed(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
  }
  std::vector<int,_std::allocator<int>_>::size(&local_28);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            (in_stack_ffffffffffffffa0,(unsigned_long)in_stack_ffffffffffffff98,0x1b7c97);
  __n = std::uniform_int_distribution<unsigned_long>::operator()
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,__n);
  vVar3 = *pvVar2;
  (**(code **)(*in_RDI + 0x40))(in_RDI,vVar3);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(vVar3,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void do_random_move(RandomEngine* engine)
	{
		auto moves = get_moves();
		attest(! moves.empty());
		std::uniform_int_distribution<std::size_t> move_ind(0, moves.size() - 1);
		auto move = moves[move_ind(*engine)];
		do_move(move);
	}